

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O3

string * libcellml::decompressMathMLDTD_abi_cxx11_(void)

{
  uchar *puVar1;
  string *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mathmlDTD;
  uLong sizeMathmlDTDUncompressedResize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  undefined8 local_10;
  
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10 = 0x5f8a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_28,0x5f8a8);
  puVar1 = compressedMathMLDTD();
  uncompress(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_10,puVar1,0x108a8);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ();
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

std::string decompressMathMLDTD()
{
    std::vector<unsigned char> mathmlDTD;
    uLong sizeMathmlDTDUncompressedResize = MATHML_DTD_LEN;
    mathmlDTD.resize(sizeMathmlDTDUncompressedResize);

    const unsigned char *a = compressedMathMLDTD();

    uncompress(&mathmlDTD[0], &sizeMathmlDTDUncompressedResize, a, COMPRESSED_MATHML_DTD_LEN);

    return std::string(mathmlDTD.begin(), mathmlDTD.end());
}